

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O1

void __thiscall
CPartialMerkleTree::CPartialMerkleTree
          (CPartialMerkleTree *this,vector<uint256,_std::allocator<uint256>_> *vTxid,
          vector<bool,_std::allocator<bool>_> *vMatch)

{
  long lVar1;
  int height;
  uint uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (uint)((ulong)((long)(vTxid->super__Vector_base<uint256,_std::allocator<uint256>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(vTxid->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl
                              .super__Vector_impl_data._M_start) >> 5);
  this->nTransactions = uVar2;
  (this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_offset = 0;
  (this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->fBad = false;
  if ((this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  height = -1;
  do {
    height = height + 1;
  } while (1 < ~(-1 << ((byte)height & 0x1f)) + uVar2 >> ((byte)height & 0x1f));
  TraverseAndBuild(this,height,0,vTxid,vMatch);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CPartialMerkleTree::CPartialMerkleTree(const std::vector<uint256> &vTxid, const std::vector<bool> &vMatch) : nTransactions(vTxid.size()), fBad(false) {
    // reset state
    vBits.clear();
    vHash.clear();

    // calculate height of tree
    int nHeight = 0;
    while (CalcTreeWidth(nHeight) > 1)
        nHeight++;

    // traverse the partial tree
    TraverseAndBuild(nHeight, 0, vTxid, vMatch);
}